

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O2

bool is_valid(Date *d)

{
  Month MVar1;
  uint uVar2;
  bool bVar3;
  
  if ((d->y < 1) || (MVar1 = d->m, 0xb < MVar1 - jan)) {
    return false;
  }
  uVar2 = d->d;
  if ((int)uVar2 < 1) {
    return false;
  }
  if (MVar1 < dec) {
    if ((0xa50U >> (MVar1 & 0x1f) & 1) != 0) {
      if (uVar2 < 0x1f) {
        return true;
      }
      goto LAB_00102475;
    }
    if (MVar1 != feb) goto LAB_00102469;
  }
  else {
LAB_00102469:
    if (uVar2 < 0x20) {
      return true;
    }
    if (MVar1 != feb) goto LAB_00102475;
  }
  bVar3 = is_leap(d);
  if (uVar2 < 0x1e && bVar3) {
    return true;
  }
LAB_00102475:
  return uVar2 < 0x1d;
}

Assistant:

bool is_valid(Date& d)
{
	bool is_valid = d.year() > 0 && (int(d.month()) > 0 && int(d.month()) < 13) && d.day() > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.month()) && d.day() < 32) ||
		(is_30_day_month(d.month()) && d.day() < 31) ||
		(d.month() == Month::feb && (is_leap(d) && d.day() < 30) || d.day() < 29)
		);
	return is_valid;
}